

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<std::__cxx11::string,char_const(&)[9],int,char_const(&)[4],int,char_const(&)[2]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,char (*args) [9],
          int *args_1,char (*args_2) [4],int *args_3,char (*args_4) [2])

{
  int *in_RCX;
  char (*in_RDX) [9];
  undefined8 in_RDI;
  char (*in_R8) [4];
  int *in_R9;
  string *in_stack_ffffffffffffff68;
  string local_70 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_50 [24];
  char (*in_stack_ffffffffffffffc8) [2];
  
  StringBuilder(in_stack_ffffffffffffff68);
  StringBuilder<char[9],int,char_const(&)[4],int,char_const(&)[2]>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}